

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::garbageCollect(Solver *this)

{
  ClauseAllocator to;
  ClauseAllocator local_30;
  
  ClauseAllocator::ClauseAllocator(&local_30,(this->ca).ra.sz - (this->ca).ra.wasted_);
  relocAll(this,&local_30);
  if (1 < this->verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->ca).ra.sz << 2),(ulong)(local_30.ra.sz << 2));
  }
  ClauseAllocator::moveTo(&local_30,&this->ca);
  free(local_30.ra.memory);
  return;
}

Assistant:

void Solver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}